

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O0

void InsertNode(void)

{
  UINT8 CharC_00;
  int iVar1;
  NODE_conflict NVar2;
  UINT8 *local_30;
  UINT8 *t2;
  UINT8 *t1;
  int local_18;
  uint uStack_14;
  UINT8 CharC;
  NODE_conflict NodeT;
  NODE_conflict Index2;
  NODE_conflict NodeR;
  NODE_conflict NodeQ;
  
  if (mMatchLen < 4) {
    Index2 = mText[mPos] + 0x80000;
    CharC_00 = mText[mPos + 1];
    NodeT = Child(Index2,CharC_00);
    if (NodeT == 0) {
      MakeChild(Index2,CharC_00,mPos);
      mMatchLen = 1;
      return;
    }
    mMatchLen = 2;
  }
  else {
    mMatchLen = mMatchLen + -1;
    NodeT = mMatchPos + 1U | 0x80000;
    Index2 = mParent[NodeT];
    while (Index2 == 0) {
      NodeT = mNext[NodeT];
      Index2 = mParent[NodeT];
    }
    while (mMatchLen <= (int)(uint)mLevel[Index2]) {
      NodeT = Index2;
      Index2 = mParent[Index2];
    }
    for (local_18 = Index2; mPosition[local_18] < 0; local_18 = mParent[local_18]) {
      mPosition[local_18] = mPos;
    }
    if (local_18 < 0x80000) {
      mPosition[local_18] = mPos | 0x80000000;
    }
  }
  while( true ) {
    if (NodeT < 0x80000) {
      uStack_14 = (uint)mLevel[NodeT];
      mMatchPos = mPosition[NodeT] & 0x7fffffff;
    }
    else {
      uStack_14 = 0x100;
      mMatchPos = NodeT;
    }
    if (mPos <= mMatchPos) {
      mMatchPos = mMatchPos + -0x80000;
    }
    t2 = mText + (mPos + mMatchLen);
    local_30 = mText + (mMatchPos + mMatchLen);
    for (; mMatchLen < (int)uStack_14; mMatchLen = mMatchLen + 1) {
      if (*t2 != *local_30) {
        Split(NodeT);
        return;
      }
      t2 = t2 + 1;
      local_30 = local_30 + 1;
    }
    if (0xff < mMatchLen) break;
    mPosition[NodeT] = mPos;
    Index2 = NodeT;
    NVar2 = Child(NodeT,*t2);
    if (NVar2 == 0) {
      MakeChild(NodeT,*t2,mPos);
      return;
    }
    mMatchLen = mMatchLen + 1;
    NodeT = NVar2;
  }
  iVar1 = mPrev[NodeT];
  mPrev[mPos] = iVar1;
  mNext[iVar1] = mPos;
  iVar1 = mNext[NodeT];
  mNext[mPos] = iVar1;
  mPrev[iVar1] = mPos;
  mParent[mPos] = Index2;
  mParent[NodeT] = 0;
  mNext[NodeT] = mPos;
  return;
}

Assistant:

STATIC
  VOID
  InsertNode (
  VOID
  )
  /*++

  Routine Description:

  Insert string info for current position into the String Info Log

  Arguments: (VOID)

  Returns: (VOID)

  --*/
{
  NODE  NodeQ;
  NODE  NodeR;
  NODE  Index2;
  NODE  NodeT;
  UINT8 CharC;
  UINT8 *t1;
  UINT8 *t2;

  if (mMatchLen >= 4) {
    //
    // We have just got a long match, the target tree
    // can be located by MatchPos + 1. Traverse the tree
    // from bottom up to get to a proper starting point.
    // The usage of PERC_FLAG ensures proper node deletion
    // DeleteNode() later.
    //
    mMatchLen--;
    NodeR = (NODE) ((mMatchPos + 1) | WNDSIZ);
    NodeQ = mParent[NodeR];
    while (NodeQ == NIL) {
      NodeR = mNext[NodeR];
      NodeQ = mParent[NodeR];
    }

    while (mLevel[NodeQ] >= mMatchLen) {
      NodeR = NodeQ;
      NodeQ = mParent[NodeQ];
    }

    NodeT = NodeQ;
    while (mPosition[NodeT] < 0) {
      mPosition[NodeT]  = mPos;
      NodeT             = mParent[NodeT];
    }

        if (NodeT < (NODE) WNDSIZ) {
      mPosition[NodeT] = (NODE) (mPos | (UINT32) PERC_FLAG);
    }
  } else {
    //
    // Locate the target tree
    //
    NodeQ = (NODE) (mText[mPos] + WNDSIZ);
    CharC = mText[mPos + 1];
    NodeR = Child (NodeQ, CharC);
    if (NodeR == NIL) {
      MakeChild (NodeQ, CharC, mPos);
      mMatchLen = 1;
      return ;
    }

    mMatchLen = 2;
  }
  //
  // Traverse down the tree to find a match.
  // Update Position value along the route.
  // Node split or creation is involved.
  //
  for (;;) {
        if (NodeR >= (NODE) WNDSIZ) {
      Index2    = MAXMATCH;
      mMatchPos = NodeR;
    } else {
      Index2    = mLevel[NodeR];
      mMatchPos = (NODE) (mPosition[NodeR] & (UINT32)~PERC_FLAG);
    }

    if (mMatchPos >= mPos) {
      mMatchPos -= WNDSIZ;
    }

    t1  = &mText[mPos + mMatchLen];
    t2  = &mText[mMatchPos + mMatchLen];
    while (mMatchLen < Index2) {
      if (*t1 != *t2) {
        Split (NodeR);
        return ;
      }

      mMatchLen++;
      t1++;
      t2++;
    }

    if (mMatchLen >= MAXMATCH) {
      break;
    }

    mPosition[NodeR]  = mPos;
    NodeQ             = NodeR;
    NodeR             = Child (NodeQ, *t1);
    if (NodeR == NIL) {
      MakeChild (NodeQ, *t1, mPos);
      return ;
    }

    mMatchLen++;
  }

  NodeT           = mPrev[NodeR];
  mPrev[mPos]     = NodeT;
  mNext[NodeT]    = mPos;
  NodeT           = mNext[NodeR];
  mNext[mPos]     = NodeT;
  mPrev[NodeT]    = mPos;
  mParent[mPos]   = NodeQ;
  mParent[NodeR]  = NIL;

  //
  // Special usage of 'next'
  //
  mNext[NodeR] = mPos;

}